

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall
cfd::Psbt::AddTxOutData(Psbt *this,Amount *amount,Address *address,KeyData *key_data)

{
  uint32_t index_00;
  KeyData *in_RCX;
  Address *in_RDX;
  Amount *in_RSI;
  Psbt *in_RDI;
  wally_psbt *psbt_pointer;
  CfdException *except;
  uint32_t index;
  Script *in_stack_ffffffffffffff20;
  Script local_60;
  uint32_t local_24;
  KeyData *local_20;
  Amount *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  core::Address::GetLockingScript(&local_60,in_RDX);
  index_00 = core::Psbt::AddTxOut(in_RDI,&local_60,local_10);
  core::Script::~Script(in_stack_ffffffffffffff20);
  local_24 = index_00;
  core::Psbt::SetTxOutData(in_RDI,index_00,local_20);
  return local_24;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const KeyData& key_data) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, key_data);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}